

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O0

void __thiscall
pbrt::RGBFilm::RGBFilm
          (RGBFilm *this,FilmBaseParameters *p,RGBColorSpace *colorSpace,Float maxComponentValue,
          bool writeFP16,Allocator alloc)

{
  bool bVar1;
  int iVar2;
  byte in_CL;
  long in_RDX;
  allocator_type in_RSI;
  long in_RDI;
  undefined8 in_R8;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  Float FVar3;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined1 local_b4 [20];
  char (*in_stack_ffffffffffffff60) [23];
  char *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff78;
  LogLevel in_stack_ffffffffffffff84;
  FilmBaseParameters *in_stack_ffffffffffffff88;
  FilmBase *in_stack_ffffffffffffff90;
  SquareMatrix<3> *in_stack_ffffffffffffff98;
  SquareMatrix<3> *in_stack_ffffffffffffffa0;
  
  iVar2 = (int)((ulong)in_R8 >> 0x20);
  FilmBaseParameters::FilmBaseParameters
            ((FilmBaseParameters *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             (FilmBaseParameters *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  FilmBase::FilmBase(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  FilmBaseParameters::~FilmBaseParameters((FilmBaseParameters *)0x75a7c7);
  *(long *)(in_RDI + 0x50) = in_RDX;
  *(undefined4 *)(in_RDI + 0x58) = in_XMM0_Da;
  *(byte *)(in_RDI + 0x5c) = in_CL & 1;
  SquareMatrix<3>::SquareMatrix((SquareMatrix<3> *)(in_RDI + 100));
  Array2D<pbrt::RGBFilm::Pixel>::Array2D
            ((Array2D<pbrt::RGBFilm::Pixel> *)(in_RDI + 0x88),
             (Bounds2i *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),in_RSI);
  FVar3 = FilterHandle::Integral
                    ((FilterHandle *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  *(Float *)(in_RDI + 0x60) = FVar3;
  bVar1 = Bounds2<int>::IsEmpty((Bounds2<int> *)(in_RDI + 8));
  if (bVar1) {
    LogFatal<char_const(&)[23]>
              (in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,iVar2,in_stack_ffffffffffffff68,
               in_stack_ffffffffffffff60);
  }
  if (in_RDX == 0) {
    LogFatal<char_const(&)[22]>
              (in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,iVar2,in_stack_ffffffffffffff68,
               (char (*) [22])in_stack_ffffffffffffff60);
  }
  iVar2 = Bounds2<int>::Area((Bounds2<int> *)
                             CONCAT44(FVar3,CONCAT13(bVar1,(int3)in_stack_ffffffffffffff20)));
  *(long *)(in_FS_OFFSET + -8) = *(long *)(in_FS_OFFSET + -8) + (long)iVar2 * 0x38;
  pbrt::operator*(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  memcpy((void *)(in_RDI + 100),local_b4,0x24);
  return;
}

Assistant:

RGBFilm::RGBFilm(FilmBaseParameters p, const RGBColorSpace *colorSpace,
                 Float maxComponentValue, bool writeFP16, Allocator alloc)
    : FilmBase(p),
      pixels(p.pixelBounds, alloc),
      colorSpace(colorSpace),
      maxComponentValue(maxComponentValue),
      writeFP16(writeFP16) {
    filterIntegral = filter.Integral();
    CHECK(!pixelBounds.IsEmpty());
    CHECK(colorSpace != nullptr);
    filmPixelMemory += pixelBounds.Area() * sizeof(Pixel);
    outputRGBFromSensorRGB = colorSpace->RGBFromXYZ * sensor->XYZFromSensorRGB;
}